

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false>::
visit<slang::ast::IntegerLiteral>
          (ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *this,
          IntegerLiteral *t)

{
  bool bVar1;
  IntegerLiteral *in_RSI;
  ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *in_RDI;
  
  bVar1 = Expression::bad(&in_RSI->super_Expression);
  if (!bVar1) {
    visitDefault<slang::ast::IntegerLiteral>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }